

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reactive_socket_send_op.hpp
# Opt level: O3

void asio::detail::
     reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
     ::do_complete(void *owner,operation *base,error_code *param_3,size_t param_4)

{
  code *pcVar1;
  binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
  handler;
  handler_work<std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor,_void>
  w;
  _Any_data local_a8;
  code *local_98;
  scheduler_operation *local_90;
  scheduler_operation *local_88;
  func_type p_Stack_80;
  scheduler_operation *local_78;
  ptr local_68;
  any_executor_base local_50;
  func_type local_20;
  
  local_68.v = (reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
                *)base;
  local_68.p = (reactive_socket_send_op<asio::const_buffers_1,_std::function<void_(const_std::error_code_&,_unsigned_long)>,_asio::any_io_executor>
                *)base;
  execution::detail::any_executor_base::any_executor_base
            (&local_50,(any_executor_base *)&base[5].func_);
  local_20 = base[7].func_;
  base[7].func_ =
       (func_type)
       execution::
       any_executor<asio::execution::context_as_t<asio::execution_context&>,asio::execution::detail::blocking::never_t<0>,asio::execution::prefer_only<asio::execution::detail::blocking::possibly_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::tracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::outstanding_work::untracked_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::fork_t<0>>,asio::execution::prefer_only<asio::execution::detail::relationship::continuation_t<0>>>
       ::prop_fns_table<void>()::fns;
  local_a8._M_unused._M_object = (scheduler_operation *)0x0;
  local_a8._8_8_ = (func_type)0x0;
  local_98 = (code *)0x0;
  local_90 = base[5].next_;
  pcVar1 = *(code **)&base[4].task_result_;
  if (pcVar1 != (code *)0x0) {
    local_a8._M_unused._M_object = base[4].next_;
    local_a8._8_8_ = base[4].func_;
    *(undefined8 *)&base[4].task_result_ = 0;
    base[5].next_ = (scheduler_operation *)0x0;
    local_98 = pcVar1;
  }
  local_88 = base[1].next_;
  p_Stack_80 = base[1].func_;
  local_78 = base[2].next_;
  local_68.h = (function<void_(const_std::error_code_&,_unsigned_long)> *)&local_a8;
  ptr::reset(&local_68);
  if (owner != (void *)0x0) {
    if (local_50.target_ == (void *)0x0) {
      binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
      ::operator()((binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
                    *)&local_a8);
    }
    else {
      execution::detail::any_executor_base::
      execute<asio::detail::binder2<std::function<void(std::error_code_const&,unsigned_long)>,std::error_code,unsigned_long>>
                (&local_50,
                 (binder2<std::function<void_(const_std::error_code_&,_unsigned_long)>,_std::error_code,_unsigned_long>
                  *)&local_a8);
    }
  }
  if (local_98 != (code *)0x0) {
    (*local_98)((_Any_data *)&local_a8,(_Any_data *)&local_a8,__destroy_functor);
  }
  if (local_50.target_ != (void *)0x0) {
    (*(local_50.object_fns_)->destroy)(&local_50);
  }
  ptr::reset(&local_68);
  return;
}

Assistant:

static void do_complete(void* owner, operation* base,
      const asio::error_code& /*ec*/,
      std::size_t /*bytes_transferred*/)
  {
    // Take ownership of the handler object.
    ASIO_ASSUME(base != 0);
    reactive_socket_send_op* o(static_cast<reactive_socket_send_op*>(base));
    ptr p = { asio::detail::addressof(o->handler_), o, o };

    ASIO_HANDLER_COMPLETION((*o));

    // Take ownership of the operation's outstanding work.
    handler_work<Handler, IoExecutor> w(
        static_cast<handler_work<Handler, IoExecutor>&&>(
          o->work_));

    ASIO_ERROR_LOCATION(o->ec_);

    // Make a copy of the handler so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the handler may be the true owner of the memory associated
    // with the handler. Consequently, a local copy of the handler is required
    // to ensure that any owning sub-object remains valid until after we have
    // deallocated the memory here.
    detail::binder2<Handler, asio::error_code, std::size_t>
      handler(o->handler_, o->ec_, o->bytes_transferred_);
    p.h = asio::detail::addressof(handler.handler_);
    p.reset();

    // Make the upcall if required.
    if (owner)
    {
      fenced_block b(fenced_block::half);
      ASIO_HANDLER_INVOCATION_BEGIN((handler.arg1_, handler.arg2_));
      w.complete(handler, handler.handler_);
      ASIO_HANDLER_INVOCATION_END;
    }
  }